

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

Ivy_Obj_t * Ivy_ManDsdConstruct_rec(Ivy_Man_t *p,Vec_Int_t *vFront,int iNode,Vec_Int_t *vTree)

{
  Ivy_Dec_t IVar1;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pB;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Ivy_Dec_t Node;
  Ivy_Dec_t local_c4;
  Ivy_Obj_t *local_c0;
  Ivy_Obj_t *local_b8 [17];
  
  IVar1 = (Ivy_Dec_t)Vec_IntEntry(vTree,iNode);
  uVar7 = (uint)IVar1 & 0xf;
  local_c4 = IVar1;
  switch(uVar7) {
  case 0:
    uVar7 = Vec_IntEntry(vFront,iNode);
    if ((-1 < (int)uVar7) && ((int)uVar7 < p->vObjs->nSize)) {
      return (Ivy_Obj_t *)((ulong)((uint)IVar1 >> 4 & 1) ^ (ulong)p->vObjs->pArray[uVar7]);
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  case 1:
    return (Ivy_Obj_t *)((ulong)((uint)IVar1 >> 4 & 1) ^ (ulong)p->pConst1);
  case 2:
    pIVar3 = Ivy_ManDsdConstruct_rec(p,vFront,(uint)IVar1 >> 9 & 7,vTree);
    break;
  case 3:
  case 4:
    uVar5 = (uint)IVar1 >> 5 & 7;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = Ivy_DecGetVar(&local_c4,(int)uVar6);
      if ((uVar7 != 3) && ((uVar2 & 1) != 0)) {
        __assert_fail("Node.Type == IVY_DEC_AND || (Var & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                      ,0x262,
                      "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                     );
      }
      pIVar3 = Ivy_ManDsdConstruct_rec(p,vFront,uVar2 >> 1,vTree);
      local_b8[uVar6] = (Ivy_Obj_t *)((ulong)(uVar2 & 1) ^ (ulong)pIVar3);
    }
    pIVar3 = Ivy_Multi(p,local_b8,uVar5,(uVar7 != 3) + IVY_AND);
    break;
  default:
    if (((uint)IVar1 & 0x10) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x26d,
                    "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                   );
    }
    if (1 < uVar7 - 5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x280,
                    "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                   );
    }
    pIVar3 = Ivy_ManDsdConstruct_rec(p,vFront,(uint)IVar1 >> 9 & 7,vTree);
    local_c0 = Ivy_ManDsdConstruct_rec(p,vFront,(uint)IVar1 >> 0xd & 7,vTree);
    pIVar4 = Ivy_ManDsdConstruct_rec(p,vFront,(uint)IVar1 >> 0x11 & 7,vTree);
    uVar5 = (uint)IVar1 >> 8 & 1;
    if (uVar5 != 0 && uVar7 != 6) {
      __assert_fail("Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x277,
                    "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                   );
    }
    pIVar3 = (Ivy_Obj_t *)((ulong)pIVar3 ^ (ulong)uVar5);
    pB = (Ivy_Obj_t *)((ulong)local_c0 ^ (ulong)((uint)IVar1 >> 0xc & 1));
    pIVar4 = (Ivy_Obj_t *)((ulong)pIVar4 ^ (ulong)((uint)IVar1 >> 0x10 & 1));
    if (uVar7 == 5) {
      pIVar3 = Ivy_Mux(p,pIVar3,pB,pIVar4);
      return pIVar3;
    }
    pIVar3 = Ivy_Maj(p,pIVar3,pB,pIVar4);
    return pIVar3;
  }
  return (Ivy_Obj_t *)((ulong)((uint)IVar1 >> 4 & 1) ^ (ulong)pIVar3);
}

Assistant:

Ivy_Obj_t * Ivy_ManDsdConstruct_rec( Ivy_Man_t * p, Vec_Int_t * vFront, int iNode, Vec_Int_t * vTree )
{
    Ivy_Obj_t * pResult, * pChild, * pNodes[16];
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        return Ivy_NotCond( Ivy_ManConst1(p), Node.fCompl );
    if ( Node.Type == IVY_DEC_PI )
    {
        pResult = Ivy_ManObj( p, Vec_IntEntry(vFront, iNode) );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    if ( Node.Type == IVY_DEC_BUF )
    {
        pResult = Ivy_ManDsdConstruct_rec( p, vFront, Node.Fan0 >> 1, vTree );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    if ( Node.Type == IVY_DEC_AND || Node.Type == IVY_DEC_EXOR )
    {
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            assert( Node.Type == IVY_DEC_AND || (Var & 1) == 0 );
            pChild = Ivy_ManDsdConstruct_rec( p, vFront, Var >> 1, vTree );
            pChild = Ivy_NotCond( pChild, (Var & 1) );
            pNodes[i] = pChild;
        }

//        Ivy_MultiEval( pNodes, Node.nFans, Node.Type == IVY_DEC_AND ? IVY_AND : IVY_EXOR );

        pResult = Ivy_Multi( p, pNodes, Node.nFans, Node.Type == IVY_DEC_AND ? IVY_AND : IVY_EXOR );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    assert( Node.fCompl == 0 );
    if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        int VarC, Var1, Var0;
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        pNodes[0] = Ivy_ManDsdConstruct_rec( p, vFront, VarC >> 1, vTree );
        pNodes[1] = Ivy_ManDsdConstruct_rec( p, vFront, Var1 >> 1, vTree );
        pNodes[2] = Ivy_ManDsdConstruct_rec( p, vFront, Var0 >> 1, vTree );
        assert( Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0 );
        pNodes[0] = Ivy_NotCond( pNodes[0], (VarC & 1) );
        pNodes[1] = Ivy_NotCond( pNodes[1], (Var1 & 1) );
        pNodes[2] = Ivy_NotCond( pNodes[2], (Var0 & 1) );
        if ( Node.Type == IVY_DEC_MUX )
            return Ivy_Mux( p, pNodes[0], pNodes[1], pNodes[2] );
        else
            return Ivy_Maj( p, pNodes[0], pNodes[1], pNodes[2] );
    }
    assert( 0 );
    return 0;
}